

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_name2ref(SAM_hdr *hdr,char *ref)

{
  kh_m_s2i_t *h;
  khint_t kVar1;
  int iVar2;
  
  h = hdr->ref_hash;
  kVar1 = kh_get_m_s2i(h,ref);
  if (kVar1 == h->n_buckets) {
    iVar2 = -1;
  }
  else {
    iVar2 = h->vals[kVar1];
  }
  return iVar2;
}

Assistant:

int sam_hdr_name2ref(SAM_hdr *hdr, const char *ref) {
    khint_t k = kh_get(m_s2i, hdr->ref_hash, ref);
    return k == kh_end(hdr->ref_hash) ? -1 : kh_val(hdr->ref_hash, k);
}